

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

int __thiscall deqp::egl::QueryConfigTests::init(QueryConfigTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  GetConfigsBoundsCase *this_00;
  GetConfigAttribCase *pGVar3;
  long lVar4;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"get_configs",
             "eglGetConfigs tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (GetConfigsBoundsCase *)operator_new(0x98);
  GetConfigsBoundsCase::GetConfigsBoundsCase
            (this_00,(this->super_TestCaseGroup).m_eglTestCtx,"get_configs_bounds",
             "eglGetConfigs bounds checking test");
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "get_config_attrib","eglGetConfigAttrib() tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar4 = 8;
  do {
    pGVar3 = (GetConfigAttribCase *)operator_new(0xc0);
    uVar1 = *(undefined4 *)(&UNK_02157788 + lVar4);
    GetConfigAttribCase::GetConfigAttribCase
              (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,
               *(char **)((long)&init::attributes[0].attribute + lVar4),
               "Simple attribute query case");
    (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__GetConfigAttribCase_02157a30;
    *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x1c8);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"constraints",
             "Attribute constraint tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pGVar3 = (GetConfigAttribCase *)operator_new(0xb8);
  GetConfigAttribCase::GetConfigAttribCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"color_buffer_size",
             "Color buffer component sizes");
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetConfigAttribCase_02157a88;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  pGVar3 = (GetConfigAttribCase *)operator_new(0xb8);
  GetConfigAttribCase::GetConfigAttribCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"transparent_value",
             "Transparent color value");
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetConfigAttribCase_02157ae0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  return extraout_EAX;
}

Assistant:

void QueryConfigTests::init (void)
{
	// eglGetGonfigs
	{
		tcu::TestCaseGroup* getConfigsGroup = new tcu::TestCaseGroup(m_testCtx, "get_configs", "eglGetConfigs tests");
		addChild(getConfigsGroup);

		getConfigsGroup->addChild(new GetConfigsBoundsCase(m_eglTestCtx, "get_configs_bounds", "eglGetConfigs bounds checking test"));
	}

	// eglGetConfigAttrib
	{
		static const struct
		{
			EGLenum			attribute;
			const char*		testName;
		} attributes[] =
		{
			{ EGL_BUFFER_SIZE,				"buffer_size"				},
			{ EGL_RED_SIZE,					"red_size"					},
			{ EGL_GREEN_SIZE,				"green_size"				},
			{ EGL_BLUE_SIZE,				"blue_size"					},
			{ EGL_LUMINANCE_SIZE,			"luminance_size"			},
			{ EGL_ALPHA_SIZE,				"alpha_size"				},
			{ EGL_ALPHA_MASK_SIZE,			"alpha_mask_size"			},
			{ EGL_BIND_TO_TEXTURE_RGB,		"bind_to_texture_rgb"		},
			{ EGL_BIND_TO_TEXTURE_RGBA,		"bind_to_texture_rgba"		},
			{ EGL_COLOR_BUFFER_TYPE,		"color_buffer_type"			},
			{ EGL_CONFIG_CAVEAT,			"config_caveat"				},
			{ EGL_CONFIG_ID,				"config_id"					},
			{ EGL_CONFORMANT,				"conformant"				},
			{ EGL_DEPTH_SIZE,				"depth_size"				},
			{ EGL_LEVEL,					"level"						},
			{ EGL_MAX_SWAP_INTERVAL,		"max_swap_interval"			},
			{ EGL_MIN_SWAP_INTERVAL,		"min_swap_interval"			},
			{ EGL_NATIVE_RENDERABLE,		"native_renderable"			},
			{ EGL_NATIVE_VISUAL_TYPE,		"native_visual_type"		},
			{ EGL_RENDERABLE_TYPE,			"renderable_type"			},
			{ EGL_SAMPLE_BUFFERS,			"sample_buffers"			},
			{ EGL_SAMPLES,					"samples"					},
			{ EGL_STENCIL_SIZE,				"stencil_size"				},
			{ EGL_SURFACE_TYPE,				"surface_type"				},
			{ EGL_TRANSPARENT_TYPE,			"transparent_type"			},
			{ EGL_TRANSPARENT_RED_VALUE,	"transparent_red_value"		},
			{ EGL_TRANSPARENT_GREEN_VALUE,	"transparent_green_value"	},
			{ EGL_TRANSPARENT_BLUE_VALUE,	"transparent_blue_value"	}
		};

		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "get_config_attrib", "eglGetConfigAttrib() tests");
		addChild(simpleGroup);

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			simpleGroup->addChild(new GetConfigAttribSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple attribute query case", attributes[ndx].attribute));
		}
	}

	// Attribute constraints
	{
		tcu::TestCaseGroup* constraintsGroup = new tcu::TestCaseGroup(m_testCtx, "constraints", "Attribute constraint tests");
		addChild(constraintsGroup);

		constraintsGroup->addChild(new GetConfigAttribBufferSizeCase(m_eglTestCtx,			"color_buffer_size",	"Color buffer component sizes"));
		constraintsGroup->addChild(new GetConfigAttribTransparentValueCase(m_eglTestCtx,	"transparent_value",	"Transparent color value"));
	}
}